

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::normalizeSimilarityMap
               (TParameters *params,TSimilarityMap *ccMap,TSimilarityMap *logMap,
               TSimilarityMap *logMapInv)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RCX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RDX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RSI;
  long in_RDI;
  double dVar5;
  TValueCC *v_2;
  int i_3;
  int j_3;
  TValueCC *v_1;
  int i_2;
  int j_2;
  TValueCC *v;
  int i_1;
  int j_1;
  int i;
  int j;
  double ccMax;
  double ccMin;
  int n;
  int local_68;
  int local_64;
  int local_58;
  int local_54;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  double local_30;
  int local_24;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_20;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_18;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::size(in_RSI);
  local_24 = (int)sVar1;
  local_30 = std::numeric_limits<double>::max();
  local_38 = std::numeric_limits<double>::min();
  for (local_3c = 0; local_40 = local_3c, local_3c < local_24 + -1; local_3c = local_3c + 1) {
    while (local_40 = local_40 + 1, local_40 < local_24) {
      pvVar2 = std::
               vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               ::operator[](local_10,(long)local_3c);
      pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_40);
      pdVar4 = std::min<double>(&local_30,&pvVar3->cc);
      local_30 = *pdVar4;
      pvVar2 = std::
               vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               ::operator[](local_10,(long)local_3c);
      pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_40);
      pdVar4 = std::max<double>(&local_38,&pvVar3->cc);
      local_38 = *pdVar4;
    }
  }
  local_30 = local_30 - 1e-06;
  local_38 = local_38 + 1e-06;
  for (local_44 = 0; local_44 < local_24; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < local_24; local_48 = local_48 + 1) {
      if (local_48 == local_44) {
        pvVar2 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_10,(long)local_44);
        pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_48);
        pvVar3->cc = 1.0;
      }
      else {
        pvVar2 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_10,(long)local_44);
        pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_48);
        pvVar3->cc = (pvVar3->cc - local_30) / (local_38 - local_30);
        dVar5 = pow(pvVar3->cc,*(double *)(local_8 + 0x10));
        pvVar3->cc = dVar5;
      }
    }
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(_i_1,(vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                    *)v);
  for (local_54 = 0; local_54 < local_24; local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 < local_24; local_58 = local_58 + 1) {
      if (local_58 == local_54) {
        pvVar2 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_18,(long)local_54);
        pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_58);
        pvVar3->cc = 0.0;
      }
      else {
        pvVar2 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_18,(long)local_54);
        pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_58);
        dVar5 = log(pvVar3->cc);
        pvVar3->cc = dVar5;
      }
    }
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(_i_1,(vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                    *)v);
  for (local_64 = 0; local_64 < local_24; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < local_24; local_68 = local_68 + 1) {
      if (local_68 == local_64) {
        pvVar2 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_18,(long)local_64);
        pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_68);
        pvVar3->cc = -1000000.0;
      }
      else {
        pvVar2 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_20,(long)local_64);
        pvVar3 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar2,(long)local_68);
        dVar5 = log(1.0 - pvVar3->cc);
        pvVar3->cc = dVar5;
      }
    }
  }
  return true;
}

Assistant:

bool normalizeSimilarityMap(
            const TParameters & params,
            TSimilarityMap & ccMap,
            TSimilarityMap & logMap,
            TSimilarityMap & logMapInv) {
        int n = ccMap.size();

        double ccMin = std::numeric_limits<double>::max();
        double ccMax = std::numeric_limits<double>::min();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccMin = std::min(ccMin, ccMap[j][i].cc);
                ccMax = std::max(ccMax, ccMap[j][i].cc);
            }
        }

        ccMin -= 1e-6;
        ccMax += 1e-6;

        //printf("ccMax = %g, ccMin = %g\n", ccMax, ccMin);

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    ccMap[j][i].cc = 1.0;
                    continue;
                }

                auto & v = ccMap[j][i].cc;
                v = (v - ccMin)/(ccMax - ccMin);
                v = std::pow(v, params.fSpread);
                //if (v < 0.50) {
                //    v = 1e-6;
                //}
                //v = 1.0 - std::exp(-1.1f*v);
            }
        }

        logMap = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = 0.0;
                    continue;
                }

                auto & v = logMap[j][i].cc;
                v = std::log(v);
            }
        }

        logMapInv = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = -1e6;
                    continue;
                }

                auto & v = logMapInv[j][i].cc;
                v = std::log(1.0 - v);
            }
        }

        return true;
    }